

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::QueuePushMethod::~QueuePushMethod(QueuePushMethod *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~QueuePushMethod((QueuePushMethod *)0x1335918);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

QueuePushMethod(KnownSystemName knownNameId, bool front) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), front(front) {}